

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer_index.h
# Opt level: O2

void __thiscall
BufferIndex<double,_long>::Buffer::range_query
          (Buffer *this,double lower_bound,double upper_bound,
          vector<std::pair<double,_long>,_std::allocator<std::pair<double,_long>_>_> *answers)

{
  ulong uVar1;
  ulong uVar2;
  long *__args_1;
  
  uVar1 = this->number;
  __args_1 = this->payloads;
  uVar2 = 0;
  while( true ) {
    if (uVar1 == uVar2) {
      return;
    }
    if (lower_bound <= (double)__args_1[-0x800]) break;
    uVar2 = uVar2 + 1;
    __args_1 = __args_1 + 1;
  }
  while( true ) {
    if (uVar1 <= uVar2) {
      return;
    }
    if (upper_bound < (double)__args_1[-0x800]) break;
    std::vector<std::pair<double,long>,std::allocator<std::pair<double,long>>>::
    emplace_back<double_const&,long_const&>
              ((vector<std::pair<double,long>,std::allocator<std::pair<double,long>>> *)answers,
               (double *)(__args_1 + -0x800),__args_1);
    uVar2 = uVar2 + 1;
    uVar1 = this->number;
    __args_1 = __args_1 + 1;
  }
  return;
}

Assistant:

void range_query(K lower_bound, K upper_bound, std::vector<std::pair<K, P>>& answers) const {
        for(size_t i = 0; i < number; i++) {
            if (!less_than(keys[i], lower_bound)) {
                while (i < number && !greater_than(keys[i], upper_bound)) {
                    answers.emplace_back(keys[i], payloads[i]);
                    i++;
                }
                return;
            }
        }
    }